

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_impl.h
# Opt level: O1

int simd_test_sse2::U64_V128V128_sse2_TestIntrinsics_Test::AddToRegistry(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<simd_test_sse2::TestIntrinsic<std::tuple<unsigned_int,_unsigned_int,_const_char_*>_>_>
  *this_01;
  TestMetaFactoryBase<std::tuple<unsigned_int,_unsigned_int,_const_char_*>_> *meta_factory;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  CodeLocation local_a0;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  CodeLocation local_58;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/simd_impl.h"
             ,"");
  paVar2 = &local_58.file.field_2;
  local_58.file._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_78,local_78 + local_70);
  local_58.line = 0xe7;
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<simd_test_sse2::TestIntrinsic<std::tuple<unsigned_int,unsigned_int,char_const*>>>
                      (this_00,"U64_V128V128_sse2",&local_58);
  meta_factory = (TestMetaFactoryBase<std::tuple<unsigned_int,_unsigned_int,_const_char_*>_> *)
                 operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)&PTR__TestMetaFactoryBase_0105de40;
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/simd_impl.h"
             ,"");
  paVar1 = &local_a0.file.field_2;
  local_a0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_c0,local_c0 + local_b8);
  local_a0.line = 0xe7;
  testing::internal::
  ParameterizedTestSuiteInfo<simd_test_sse2::TestIntrinsic<std::tuple<unsigned_int,_unsigned_int,_const_char_*>_>_>
  ::AddTestPattern(this_01,"U64_V128V128_sse2","TestIntrinsics",meta_factory,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.file._M_dataplus._M_p);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.file._M_dataplus._M_p);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return 0;
}

Assistant:

MY_TEST_P(ARCH_POSTFIX(U64_V128V128), TestIntrinsics) {
  TestSimd2Args<uint64_t, c_v128, c_v128>(kIterations, mask, maskwidth, name);
}